

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::BindHoleAttributeTest::iterate(BindHoleAttributeTest *this)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  deInt32 dVar1;
  int local_444;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  local_428;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  Bind local_3d0;
  Cond local_3a8;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  Attribute local_340;
  deUint32 local_2bc;
  undefined1 local_2b8 [4];
  int loc;
  allocator<char> local_289;
  string local_288;
  Attribute local_268;
  allocator<char> local_1e1;
  string local_1e0;
  Bind local_1c0;
  Cond local_198;
  allocator<char> local_169;
  string local_168;
  Attribute local_148;
  int local_c4;
  undefined1 local_c0 [4];
  int ndx;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  int arrayElementCount;
  undefined1 local_68 [8];
  AttribType vec4;
  undefined1 local_28 [4];
  deInt32 maxAttributes;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  BindHoleAttributeTest *this_local;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            *)local_28);
  dVar1 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arrayElementCount,"vec4",
             (allocator<char> *)
             ((long)&attributes.
                     super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  AttributeLocationTestUtil::AttribType::AttribType
            ((AttribType *)local_68,(string *)&arrayElementCount,1,0x8b52);
  std::__cxx11::string::~string((string *)&arrayElementCount);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&attributes.
                     super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (this->m_arraySize == -1) {
    local_444 = 1;
  }
  else {
    local_444 = this->m_arraySize;
  }
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_444;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            *)&bindings.
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"a_0",&local_169);
  AttributeLocationTestUtil::Cond::Cond(&local_198,COND_ALWAYS);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_148,(AttribType *)local_68,&local_168,-1,&local_198,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *)&bindings.
                  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_148);
  AttributeLocationTestUtil::Attribute::~Attribute(&local_148);
  AttributeLocationTestUtil::Cond::~Cond(&local_198);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"a_0",&local_1e1);
  AttributeLocationTestUtil::Bind::Bind(&local_1c0,&local_1e0,0);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *)local_c0,&local_1c0);
  AttributeLocationTestUtil::Bind::~Bind(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"a_1",&local_289);
  AttributeLocationTestUtil::Cond::Cond((Cond *)local_2b8,COND_ALWAYS);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_268,&this->m_type,&local_288,-1,(Cond *)local_2b8,this->m_arraySize);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *)&bindings.
                  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_268);
  AttributeLocationTestUtil::Attribute::~Attribute(&local_268);
  AttributeLocationTestUtil::Cond::~Cond((Cond *)local_2b8);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  local_c4 = 2;
  local_2bc = AttributeLocationTestUtil::AttribType::getLocationSize(&this->m_type);
  local_2bc = local_2bc *
              (int)attributes.
                   super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
  while (local_2bc = local_2bc + 1, (int)local_2bc < dVar1) {
    de::toString<int>(&local_380,&local_c4);
    std::operator+(&local_360,"a_",&local_380);
    AttributeLocationTestUtil::Cond::Cond(&local_3a8,COND_ALWAYS);
    AttributeLocationTestUtil::Attribute::Attribute
              (&local_340,(AttribType *)local_68,&local_360,-1,&local_3a8,-1);
    std::
    vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
    ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                 *)&bindings.
                    super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_340);
    AttributeLocationTestUtil::Attribute::~Attribute(&local_340);
    AttributeLocationTestUtil::Cond::~Cond(&local_3a8);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    de::toString<int>(&local_410,&local_c4);
    std::operator+(&local_3f0,"a_",&local_410);
    AttributeLocationTestUtil::Bind::Bind(&local_3d0,&local_3f0,local_2bc);
    std::
    vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
    ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                 *)local_c0,&local_3d0);
    AttributeLocationTestUtil::Bind::~Bind(&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    local_c4 = local_c4 + 1;
  }
  testCtx = (this->super_TestCase).super_TestNode.m_testCtx;
  renderCtx = this->m_renderCtx;
  local_428.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::vector(&local_428);
  AttributeLocationTestUtil::runTest
            (testCtx,renderCtx,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&bindings.
                 super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
              *)local_28,
             (vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
              *)local_c0,
             (vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
              *)local_28,false,false,&local_428);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&local_428);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             *)local_c0);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&bindings.
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  AttributeLocationTestUtil::AttribType::~AttribType((AttribType *)local_68);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             *)local_28);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult BindHoleAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes = getMaxAttributeLocations(m_renderCtx);
	const AttribType	vec4("vec4", 1, GL_FLOAT_VEC4);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Attribute>	attributes;
	vector<Bind>		bindings;
	int					ndx;

	attributes.push_back(Attribute(vec4, "a_0"));
	bindings.push_back(Bind("a_0", 0));

	attributes.push_back(Attribute(m_type, "a_1", Attribute::LOC_UNDEF, Cond::COND_ALWAYS, m_arraySize));

	ndx = 2;
	for (int loc = 1 + m_type.getLocationSize() * arrayElementCount; loc < maxAttributes; loc++)
	{
		attributes.push_back(Attribute(vec4, "a_" + de::toString(ndx)));
		bindings.push_back(Bind("a_" + de::toString(ndx), loc));

		ndx++;
	}

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false);
	return STOP;
}